

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgestures.h
# Opt level: O2

void ProcessGestureEvent(GestureEvent event)

{
  float fVar1;
  anon_struct_16_3_87c46a66_for_Pinch aVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  aVar2 = GESTURES.Pinch;
  GESTURES.Touch.pointCount = event.pointCount;
  fVar7 = event.position[0].x;
  fVar8 = event.position[0].y;
  if (event.pointCount == 2) {
    if (event.touchAction == 0) {
      GESTURES.Touch.pointCount = 0;
      GESTURES.current = 0;
      GESTURES.Pinch = (anon_struct_16_3_87c46a66_for_Pinch)ZEXT816(0);
    }
    else {
      fVar3 = event.position[1].x;
      fVar1 = event.position[1].y;
      if (event.touchAction == 2) {
        fVar5 = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
        fVar6 = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;
        GESTURES.Pinch.distance = SQRT(fVar5 * fVar5 + fVar6 * fVar6);
        aVar2 = GESTURES.Pinch;
        GESTURES.Touch.moveDownPositionA = event.position[0];
        GESTURES.Touch.moveDownPositionB = event.position[1];
        GESTURES.Pinch.vector.y = fVar1 - fVar8;
        GESTURES.Pinch.vector.x = fVar3 - fVar7;
        GESTURES.Pinch._8_8_ = aVar2._8_8_;
        fVar5 = fVar7 - GESTURES.Touch.previousPositionA.x;
        fVar6 = fVar8 - GESTURES.Touch.previousPositionA.y;
        if ((0.005 <= SQRT(fVar5 * fVar5 + fVar6 * fVar6)) ||
           (fVar5 = fVar3 - GESTURES.Touch.previousPositionB.x,
           fVar6 = fVar1 - GESTURES.Touch.previousPositionB.y,
           0.005 <= SQRT(fVar5 * fVar5 + fVar6 * fVar6))) {
          fVar5 = GESTURES.Touch.previousPositionB.x - GESTURES.Touch.previousPositionA.x;
          fVar6 = GESTURES.Touch.previousPositionB.y - GESTURES.Touch.previousPositionA.y;
          if (SQRT(fVar5 * fVar5 + fVar6 * fVar6) <=
              SQRT((fVar3 - fVar7) * (fVar3 - fVar7) + (fVar1 - fVar8) * (fVar1 - fVar8))) {
            GESTURES.current = 0x200;
          }
          else {
            GESTURES.current = 0x100;
          }
        }
        else {
          GESTURES.current = 4;
          GESTURES.Hold.timeDuration = glfwGetTime();
        }
        fVar7 = rgVector2Angle(GESTURES.Touch.moveDownPositionA,GESTURES.Touch.moveDownPositionB);
        GESTURES.Pinch.angle = 360.0 - fVar7;
      }
      else if (event.touchAction == 1) {
        GESTURES.Touch.downPositionA = event.position[0];
        GESTURES.Touch.downPositionB = event.position[1];
        GESTURES.Touch.previousPositionA = event.position[0];
        GESTURES.Touch.previousPositionB = event.position[1];
        GESTURES.Pinch.vector.y = fVar1 - fVar8;
        GESTURES.Pinch.vector.x = fVar3 - fVar7;
        GESTURES.Pinch._8_8_ = aVar2._8_8_;
        GESTURES.current = 4;
        GESTURES.Hold.timeDuration = glfwGetTime();
      }
    }
  }
  else if (event.pointCount == 1) {
    if (event.touchAction == 0) {
      if ((GESTURES.current == 4) || (GESTURES.current == 8)) {
        GESTURES.Touch.upPosition = event.position[0];
      }
      fVar7 = GESTURES.Touch.upPosition.x - GESTURES.Touch.downPositionA.x;
      fVar8 = GESTURES.Touch.upPosition.y - GESTURES.Touch.downPositionA.y;
      fVar7 = SQRT(fVar7 * fVar7 + fVar8 * fVar8);
      GESTURES.Drag.distance = fVar7;
      dVar4 = glfwGetTime();
      GESTURES.Drag.intensity = fVar7 / (float)(dVar4 - GESTURES.Swipe.startTime);
      if ((GESTURES.Drag.intensity <= 0.2) || (GESTURES.current == 8)) {
        GESTURES.Drag.intensity = 0.0;
        GESTURES.Drag.angle = 0.0;
        GESTURES.Drag.distance = 0.0;
        GESTURES.current = 0;
      }
      else {
        fVar7 = rgVector2Angle(GESTURES.Touch.downPositionA,GESTURES.Touch.upPosition);
        GESTURES.Drag.angle = 360.0 - fVar7;
        GESTURES.current = 0x10;
        if ((30.0 <= GESTURES.Drag.angle) && (GESTURES.Drag.angle <= 330.0)) {
          if ((GESTURES.Drag.angle < 30.0) || (150.0 < GESTURES.Drag.angle)) {
            if ((GESTURES.Drag.angle <= 150.0) || (210.0 <= GESTURES.Drag.angle)) {
              GESTURES.current =
                   (-(uint)(210.0 <= GESTURES.Drag.angle && GESTURES.Drag.angle <= 330.0) & 1) << 7;
            }
            else {
              GESTURES.current = 0x20;
            }
          }
          else {
            GESTURES.current = 0x40;
          }
        }
      }
      GESTURES.Touch.downDragPosition.x = 0.0;
      GESTURES.Touch.downDragPosition.y = 0.0;
      GESTURES.Touch.pointCount = 0;
    }
    else if (event.touchAction == 2) {
      GESTURES.Touch.moveDownPositionA = event.position[0];
      if (GESTURES.current == 4) {
        if (GESTURES.Hold.resetRequired) {
          GESTURES.Touch.downPositionA = event.position[0];
        }
        GESTURES.Hold.resetRequired = false;
        dVar4 = glfwGetTime();
        if (0.30000001192092896 < dVar4 - GESTURES.Touch.eventTime) {
          GESTURES.Touch.eventTime = glfwGetTime();
          GESTURES.current = 8;
        }
      }
      GESTURES.Drag.vector.x =
           GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
      GESTURES.Drag.vector.y =
           GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
    }
    else if (event.touchAction == 1) {
      if (((GESTURES.Touch.tapCounter < 1 || GESTURES.current != 0) ||
          (GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1, dVar4 = glfwGetTime(),
          0.30000001192092896 <= dVar4 - GESTURES.Touch.eventTime)) ||
         (fVar7 = fVar7 - GESTURES.Touch.downPositionA.x,
         fVar8 = fVar8 - GESTURES.Touch.downPositionA.y, 0.03 <= SQRT(fVar7 * fVar7 + fVar8 * fVar8)
         )) {
        GESTURES.current = 1;
        GESTURES.Touch.tapCounter = GESTURES.current;
      }
      else {
        GESTURES.current = 2;
        GESTURES.Touch.tapCounter = 0;
      }
      GESTURES.Touch.downPositionA = event.position[0];
      GESTURES.Touch.downDragPosition = event.position[0];
      GESTURES.Touch.upPosition = event.position[0];
      GESTURES.Touch.eventTime = glfwGetTime();
      GESTURES.Swipe.startTime = glfwGetTime();
      GESTURES.Drag.vector.x = 0.0;
      GESTURES.Drag.vector.y = 0.0;
    }
  }
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount == 1)     // One touch point
    {
        if (event.touchAction == TOUCH_ACTION_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((rgGetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (rgVector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = rgGetCurrentTime();

            GESTURES.Swipe.startTime = rgGetCurrentTime();

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_ACTION_UP)
        {
            // A swipe can happen while the current gesture is drag, but (specially for web) also hold, so set upPosition for both cases
            if (GESTURES.current == GESTURE_DRAG || GESTURES.current == GESTURE_HOLD) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependent on the resolution of the screen
            GESTURES.Drag.distance = rgVector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((rgGetCurrentTime() - GESTURES.Swipe.startTime));

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.current != GESTURE_DRAG))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - rgVector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;          // Right
                else if ((GESTURES.Drag.angle >= 30) && (GESTURES.Drag.angle <= 150)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 150) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;     // Left
                else if ((GESTURES.Drag.angle >= 210) && (GESTURES.Drag.angle <= 330)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_ACTION_MOVE)
        {
            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if ((rgGetCurrentTime() - GESTURES.Touch.eventTime) > DRAG_TIMEOUT)
                {
                    GESTURES.Touch.eventTime = rgGetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else if (GESTURES.Touch.pointCount == 2)    // Two touch points
    {
        if (event.touchAction == TOUCH_ACTION_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            GESTURES.Touch.previousPositionA = GESTURES.Touch.downPositionA;
            GESTURES.Touch.previousPositionB = GESTURES.Touch.downPositionB;

            //GESTURES.Pinch.distance = rgVector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = rgGetCurrentTime();
        }
        else if (event.touchAction == TOUCH_ACTION_MOVE)
        {
            GESTURES.Pinch.distance = rgVector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((rgVector2Distance(GESTURES.Touch.previousPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (rgVector2Distance(GESTURES.Touch.previousPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ( rgVector2Distance(GESTURES.Touch.previousPositionA, GESTURES.Touch.previousPositionB) > rgVector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) ) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = rgGetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - rgVector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_ACTION_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
    else if (GESTURES.Touch.pointCount > 2)     // More than two touch points
    {
        // TODO: Process gesture events for more than two points
    }
}